

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_dri(j_decompress_ptr cinfo)

{
  byte bVar1;
  jpeg_source_mgr *pjVar2;
  boolean bVar3;
  uint uVar4;
  size_t local_40;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  uint tmp;
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar2->next_input_byte;
  local_40 = pjVar2->bytes_in_buffer;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  local_40 = local_40 - 1;
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  local_40 = local_40 - 1;
  if ((ulong)*(byte *)bytes_in_buffer + (ulong)bVar1 * 0x100 != 4) {
    cinfo->err->msg_code = 0xc;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  local_40 = local_40 - 1;
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (local_40 == 0) {
    bVar3 = (*pjVar2->fill_input_buffer)(cinfo);
    if (bVar3 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar2->next_input_byte;
    local_40 = pjVar2->bytes_in_buffer;
  }
  uVar4 = (uint)*(byte *)bytes_in_buffer + (uint)bVar1 * 0x100;
  cinfo->err->msg_code = 0x54;
  (cinfo->err->msg_parm).i[0] = uVar4;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  cinfo->restart_interval = uVar4;
  pjVar2->next_input_byte = (JOCTET *)(bytes_in_buffer + 1);
  pjVar2->bytes_in_buffer = local_40 - 1;
  return 1;
}

Assistant:

LOCAL(boolean)
get_dri (j_decompress_ptr cinfo)
/* Process a DRI marker */
{
  INT32 length;
  unsigned int tmp;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  
  if (length != 4)
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  INPUT_2BYTES(cinfo, tmp, return FALSE);

  TRACEMS1(cinfo, 1, JTRC_DRI, tmp);

  cinfo->restart_interval = tmp;

  INPUT_SYNC(cinfo);
  return TRUE;
}